

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgmres.hpp
# Opt level: O2

void __thiscall Cgmres<Model>::control(Cgmres<Model> *this,double *u,double *x)

{
  int __numer;
  double U_buf [75];
  double b_vec [75];
  
  Model::dxdt(this->x_dxh,x,this->U,this->ptau);
  mul(this->x_dxh,this->x_dxh,0.002,4);
  add(this->x_dxh,this->x_dxh,x,4);
  F_func(this,this->F_dxh_h,this->U,this->x_dxh,this->t + 0.002);
  F_func(this,b_vec,this->U,x,this->t);
  mul(b_vec,b_vec,-1.0,0x4b);
  sub(b_vec,b_vec,this->F_dxh_h,0x4b);
  __numer = (int)b_vec;
  div(__numer,__numer);
  Gmres::gmres(&this->super_Gmres,this->dUdt,b_vec);
  mul(U_buf,this->dUdt,0.001,0x4b);
  add(this->U,this->U,U_buf,0x4b);
  this->t = this->t + 0.001;
  mov(u,this->U,3);
  return;
}

Assistant:

void control(double* u, const double* x) {
    double b_vec[len];
    double U_buf[len];

    // x + dxdt * h
    Model::dxdt(x_dxh, x, &U[0], &ptau[0]);
    mul(x_dxh, x_dxh, h, dim_x);
    add(x_dxh, x_dxh, x, dim_x);

    // F(U, x + dxdt * h, t + h)
    F_func(F_dxh_h, U, x_dxh, t + h);

    // F(U, x, t)
    F_func(b_vec, U, x, t);

    // (F(U, x, t) * (1 - zeta * h) - F(U, x + dxdt * h, t + h)) / h
    mul(b_vec, b_vec, (1 - zeta * h), len);
    sub(b_vec, b_vec, F_dxh_h, len);
    div(b_vec, b_vec, h, len);

    // GMRES
    gmres(dUdt, b_vec);

    // U = U + dUdt * dt
    mul(U_buf, dUdt, dt, len);
    add(U, U, U_buf, len);

    // t = t + dt
    // This value may not overflow due to loss of trailing digits
    t = t + dt;

    mov(u, &U[0], dim_u);
  }